

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

int64_t celero::GetRAMPhysicalTotal(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return sStack_78.mem_unit * sStack_78.totalram;
}

Assistant:

int64_t celero::GetRAMPhysicalTotal()
{
#ifdef _WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullTotalPhys);
#elif defined(__APPLE__)
	return -1;
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	return memInfo.totalram * memInfo.mem_unit;
#endif
}